

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O1

void sexp_emit_push(sexp_conflict ctx,sexp_conflict obj)

{
  sexp *ppsVar1;
  sexp psVar2;
  sexp psVar3;
  
  sexp_emit(ctx,'\x0f');
  sexp_emit_word(ctx,(sexp_uint_t)obj);
  ppsVar1 = &(((ctx->value).opcode.methods)->value).type.id;
  *ppsVar1 = (sexp)((long)&(*ppsVar1)->tag + 2);
  psVar2 = (ctx->value).opcode.methods;
  psVar3 = (psVar2->value).type.id;
  if ((long)(psVar2->value).type.print >> 1 < (long)psVar3 >> 1) {
    (psVar2->value).type.print = psVar3;
  }
  bytecode_preserve(ctx,obj);
  return;
}

Assistant:

static void sexp_emit_push (sexp ctx, sexp obj) {
  sexp_emit(ctx, SEXP_OP_PUSH);
  sexp_emit_word(ctx, (sexp_uint_t)obj);
  sexp_inc_context_depth(ctx, 1);
  bytecode_preserve(ctx, obj);
}